

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoConvert<float,int>(Thread *this,Ptr *out_trap)

{
  Value VVar1;
  
  VVar1 = Pop(this);
  Push<float>(this,(float)(int)VVar1.field_0.i32_);
  return Ok;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}